

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O3

void client(int count)

{
  bool bVar1;
  int iVar2;
  Addr local_170;
  undefined1 local_f8 [8];
  Addr addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  Poller *local_50 [2];
  code *local_40;
  code *local_38;
  
  if (0 < count) {
    do {
      addr.sockaddr._92_8_ = 0;
      addr.sockaddr._100_8_ = 0;
      addr.sockaddr._76_8_ = 0;
      addr.sockaddr._84_8_ = 0;
      addr.sockaddr._60_8_ = 0;
      addr.sockaddr._68_8_ = 0;
      addr.sockaddr._44_8_ = 0;
      addr.sockaddr._52_8_ = 0;
      addr.sockaddr._28_8_ = 0;
      addr.sockaddr._36_8_ = 0;
      addr.sockaddr._12_8_ = 0;
      addr.sockaddr._20_8_ = 0;
      stack0xffffffffffffff0c = 0;
      addr.sockaddr._4_8_ = 0;
      addr.sockaddr._108_4_ = 0;
      local_f8._0_4_ = 0xb8220002;
      iVar2 = inet_pton(2,ip,local_f8 + 4);
      if (-1 < iVar2) {
        addr.sockaddr._108_4_ = 2;
      }
      addr.sockaddr.un.sun_path[0x66] = -1 < iVar2;
      addr.sockaddr._105_3_ = 0;
      local_170.addrType = 0;
      local_170.family = 0;
      local_50[0] = &poller_;
      std::__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<hwnet::TCPConnector>,hwnet::Poller*&,hwnet::Addr_const&,hwnet::Addr_const&>
                ((__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2> *)&addr.addrType,
                 (allocator<hwnet::TCPConnector> *)&local_70,local_50,(Addr *)local_f8,&local_170);
      local_50[1] = (Poller *)0x0;
      local_50[0] = (Poller *)onConnect;
      local_38 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
      local_40 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
      local_68 = 0;
      local_70 = connectError;
      local_58 = std::
                 _Function_handler<void_(int,_const_hwnet::Addr_&),_void_(*)(int,_const_hwnet::Addr_&)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<void_(int,_const_hwnet::Addr_&),_void_(*)(int,_const_hwnet::Addr_&)>
                 ::_M_manager;
      bVar1 = hwnet::TCPConnector::Connect
                        ((TCPConnector *)addr._112_8_,(ConnectCallback *)local_50,
                         (ErrorCallback *)&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)((allocator<hwnet::TCPConnector> *)&local_70,
                    (allocator<hwnet::TCPConnector> *)&local_70,3);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)((_Any_data *)local_50,(_Any_data *)local_50,__destroy_functor);
      }
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (!bVar1) {
        puts("connect error");
      }
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void client(int count) {
	for(int i = 0; i < count; ++i) {
		if(!TCPConnector::New(&poller_,Addr::MakeIP4Addr(ip,port))->Connect(onConnect,connectError)){
			printf("connect error\n");
		}
	}
}